

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableWidget::setCurrentItem(QTableWidget *this,QTableWidgetItem *item,SelectionFlags command)

{
  QTableWidgetPrivate *this_00;
  Data *pDVar1;
  QTableModel *__s;
  QObject *pQVar2;
  long in_FS_OFFSET;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableWidgetPrivate **)
             &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
              super_QFrame.super_QWidget.field_0x8;
  pDVar1 = (this_00->super_QTableViewPrivate).super_QAbstractItemViewPrivate.selectionModel.wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QObject *)0x0;
  }
  else {
    pQVar2 = (this_00->super_QTableViewPrivate).super_QAbstractItemViewPrivate.selectionModel.wp.
             value;
  }
  __s = QTableWidgetPrivate::tableModel(this_00);
  QTableModel::index((QTableModel *)&stack0xffffffffffffffc0,(char *)__s,(int)item);
  (**(code **)(*(long *)pQVar2 + 0x60))
            (pQVar2,(QTableModel *)&stack0xffffffffffffffc0,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setCurrentItem(QTableWidgetItem *item, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableWidget);
    d->selectionModel->setCurrentIndex(d->tableModel()->index(item), command);
}